

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOutput_unix.cpp
# Opt level: O3

int Lodtalk::OSIO::stWriteOffsetSizeTo(InterpreterProxy *interpreter)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ssize_t sVar6;
  long lVar7;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) != 4) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  uVar2 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
  uVar3 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,1);
  uVar4 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,2);
  uVar5 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,3);
  if (((((uVar2 & 7) == 0) &&
       (0x4000000000 < (*(ulong *)CONCAT44(extraout_var_00,uVar2) & 0xf800000000))) &&
      ((uVar3 & 1) != 0)) &&
     ((((uVar4 & 1) != 0 && ((uVar5 & 1) != 0)) &&
      (lVar7 = CONCAT44(extraout_var_01,uVar3) >> 1, -1 < lVar7)))) {
    sVar6 = write((int)(CONCAT44(extraout_var_03,uVar5) >> 1),
                  (void *)((long)CONCAT44(extraout_var_00,uVar2) + lVar7 + 8),
                  CONCAT44(extraout_var_02,uVar4) >> 1);
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x15])(interpreter,sVar6);
    return iVar1;
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  return iVar1;
}

Assistant:

int OSIO::stWriteOffsetSizeTo(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 4)
        return interpreter->primitiveFailed();

    Oop bufferOop = interpreter->getTemporary(0);
    Oop offsetOop = interpreter->getTemporary(1);
    Oop sizeOop = interpreter->getTemporary(2);
    Oop fileOop = interpreter->getTemporary(3);

	// Check the arguments.
	if(!bufferOop.isIndexableNativeData() || !offsetOop.isSmallInteger() || !sizeOop.isSmallInteger() || !fileOop.isSmallInteger())
		return interpreter->primitiveFailed();

	// Decode the arguments
	auto buffer = reinterpret_cast<uint8_t *> (bufferOop.getFirstFieldPointer());
	auto offset = offsetOop.decodeSmallInteger();
	auto size = sizeOop.decodeSmallInteger();
	auto file = fileOop.decodeSmallInteger();

	// Validate some of the arguments.
	if(offset < 0)
		return interpreter->primitiveFailed();

	// Perform the write
	auto res = write(file, buffer + offset, size);
	return interpreter->returnSmallInteger(res);
}